

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  pointer pGVar1;
  pointer plVar2;
  int iVar3;
  GGMNode *i;
  GGMTree *this;
  pointer pGVar4;
  pointer plVar5;
  long in_stack_ffffffffffffff08;
  vector<GGMNode,_std::allocator<GGMNode>_> remain_node;
  uint8_t uStack_d0;
  uint8_t uStack_cf;
  uint8_t uStack_ce;
  uint8_t uStack_cd;
  vector<long,_std::allocator<long>_> remain_pos;
  vector<GGMNode,_std::allocator<GGMNode>_> node_list;
  vector<long,_std::allocator<long>_> delete_pos;
  vector<long,_std::allocator<long>_> pos;
  _Vector_base<GGMNode,_std::allocator<GGMNode>_> local_48;
  
  this = (GGMTree *)operator_new(4);
  GGMTree::GGMTree(this,8);
  pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar3 = 0;
  while (remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
         super__Vector_impl_data._M_start =
              (pointer)CONCAT44(remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,iVar3), iVar3 < 8) {
    std::vector<long,std::allocator<long>>::emplace_back<int&>
              ((vector<long,std::allocator<long>> *)&pos,(int *)&remain_node);
    iVar3 = (int)remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                 super__Vector_impl_data._M_start + 1;
  }
  delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  std::vector<long,_std::allocator<long>_>::emplace_back<int>(&delete_pos,(int *)&remain_node);
  remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::insert_iterator<std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start,pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish,
             delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             delete_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish,&remain_pos,0);
  node_list.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  node_list.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  node_list.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<GGMNode,_std::allocator<GGMNode>_>::reserve
            (&node_list,
             (long)remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  plVar2 = remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar5 = remain_pos.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start; plVar5 != plVar2; plVar5 = plVar5 + 1) {
    pGVar1 = (pointer)*plVar5;
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = GGMTree::get_level(this);
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_1_ = '\0';
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._5_1_ = '\0';
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = '\0';
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = '\0';
    uStack_d0 = '\0';
    uStack_cf = '\0';
    uStack_ce = '\0';
    uStack_cd = '\0';
    remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
    super__Vector_impl_data._M_start = pGVar1;
    std::vector<GGMNode,_std::allocator<GGMNode>_>::emplace_back<GGMNode>
              (&node_list,(GGMNode *)&remain_node);
  }
  std::vector<GGMNode,_std::allocator<GGMNode>_>::vector
            ((vector<GGMNode,_std::allocator<GGMNode>_> *)&local_48,&node_list);
  GGMTree::min_coverage(&remain_node,this,(vector<GGMNode,_std::allocator<GGMNode>_> *)&local_48);
  std::_Vector_base<GGMNode,_std::allocator<GGMNode>_>::~_Vector_base(&local_48);
  pGVar1 = (pointer)CONCAT44(remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>.
                             _M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (int)remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
  for (pGVar4 = remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>._M_impl.
                super__Vector_impl_data._M_start; pGVar4 != pGVar1; pGVar4 = pGVar4 + 1) {
    builtin_memcpy(pGVar4->key,"0123456789123456",0x10);
    GGMTree::derive_key_from_tree(pGVar4->key,pGVar4->index,pGVar4->level,0);
  }
  std::
  _Hashtable<long,_std::pair<const_long,_unsigned_char_*>,_std::allocator<std::pair<const_long,_unsigned_char_*>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&keys._M_h);
  iVar3 = GGMTree::get_level(this);
  PPRF_compute_all_keys(&remain_node,iVar3);
  PPRF_Eval(in_stack_ffffffffffffff08);
  PPRF_Eval(in_stack_ffffffffffffff08);
  PPRF_Eval(in_stack_ffffffffffffff08);
  std::_Vector_base<GGMNode,_std::allocator<GGMNode>_>::~_Vector_base
            (&remain_node.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>);
  std::_Vector_base<GGMNode,_std::allocator<GGMNode>_>::~_Vector_base
            (&node_list.super__Vector_base<GGMNode,_std::allocator<GGMNode>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&remain_pos.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&delete_pos.super__Vector_base<long,_std::allocator<long>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&pos.super__Vector_base<long,_std::allocator<long>_>);
  return 0;
}

Assistant:

int main() {
    /*Setup  */
    uint8_t *key = (unsigned char*) "0123456789123456";
    GGMTree *tree;
    tree = new GGMTree(GGM_SIZE);

    /*Punc */
    vector<long> pos;
    for (int i = 0; i < GGM_SIZE; ++i) {
        pos.emplace_back(i);
    }
    vector<long> delete_pos ;
    delete_pos.emplace_back(1);

    vector<long> remain_pos;
    set_difference(pos.begin(), pos.end(),
                   delete_pos.begin(), delete_pos.end(),
                   inserter(remain_pos, remain_pos.begin()));

    vector<GGMNode> node_list;
    node_list.reserve(remain_pos.size()); //preallocate memory for vector
    for (long pos : remain_pos) {
        node_list.emplace_back(GGMNode(pos, tree->get_level()));
    }
    vector<GGMNode> remain_node = tree->min_coverage(node_list);

    for(auto & i : remain_node) {
        memcpy(i.key, key, AES_BLOCK_SIZE);
        GGMTree::derive_key_from_tree(i.key, i.index, i.level, 0);
    }
    /*Eval */
    keys.clear();

    PPRF_compute_all_keys(remain_node, tree->get_level());// precompute all keys of nodes

    PPRF_Eval(1);
    PPRF_Eval(2);
    PPRF_Eval(0);

    return 0;
}